

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
fmt::v10::
make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,void*,std::__cxx11::string,std::__cxx11::string>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,v10 *this,void **args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  longlong lVar1;
  size_t sVar2;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  void **args_local;
  undefined1 local_149;
  char *local_148;
  size_t local_140;
  undefined1 local_133;
  undefined1 local_132;
  undefined1 local_131;
  bool formattable_2;
  bool formattable_pointer_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_130;
  bool formattable_char_2;
  char *local_128 [3];
  undefined1 local_109;
  char *local_108;
  size_t local_100;
  undefined1 local_f3;
  undefined1 local_f2;
  undefined1 local_f1;
  bool formattable_1;
  bool formattable_pointer_1;
  void **ppvStack_f0;
  bool formattable_char_1;
  char *local_e8 [2];
  void **local_d8;
  undefined1 *local_d0;
  basic_string_view<char> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  undefined1 *local_b0;
  basic_string_view<char> local_a8;
  char **local_98;
  basic_string_view<char> local_90;
  char **local_80;
  basic_string_view<char> local_78;
  undefined1 local_64;
  undefined1 local_63;
  undefined1 local_62;
  undefined1 local_61;
  bool formattable;
  bool formattable_pointer;
  v10 *pvStack_60;
  bool formattable_char;
  undefined1 local_58 [8];
  size_t local_50;
  longlong local_48;
  undefined1 *local_40;
  longlong local_38;
  undefined1 *local_30;
  
  local_61 = 1;
  local_62 = 1;
  local_63 = 1;
  lVar1 = *(longlong *)this;
  local_40 = &local_64;
  local_30 = local_58;
  local_f1 = 1;
  local_f2 = 1;
  local_f3 = 1;
  local_d0 = &local_109;
  ppvStack_f0 = args;
  local_d8 = args;
  pvStack_60 = this;
  local_48 = lVar1;
  local_38 = lVar1;
  local_c8 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
  local_108 = local_c8.data_;
  local_100 = local_c8.size_;
  local_90.data_ = local_c8.data_;
  local_90.size_ = local_c8.size_;
  local_98 = local_e8;
  local_e8[0] = basic_string_view<char>::data(&local_90);
  sVar2 = basic_string_view<char>::size(&local_90);
  local_131 = 1;
  local_132 = 1;
  local_133 = 1;
  local_b0 = &local_149;
  pbStack_130 = args_1;
  local_b8 = args_1;
  local_a8 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>(args_1);
  local_148 = local_a8.data_;
  local_140 = local_a8.size_;
  local_78.data_ = local_a8.data_;
  local_78.size_ = local_a8.size_;
  local_80 = local_128;
  local_128[0] = basic_string_view<char>::data(&local_78);
  sVar3 = basic_string_view<char>::size(&local_78);
  (__return_storage_ptr__->data_).args_[0].field_0.long_long_value = lVar1;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_50;
  (__return_storage_ptr__->data_).args_[1].field_0.string.data = local_e8[0];
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = sVar2;
  (__return_storage_ptr__->data_).args_[2].field_0.string.data = local_128[0];
  (__return_storage_ptr__->data_).args_[2].field_0.string.size = sVar3;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}